

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O2

value * mjs::anon_unknown_110::array_reduce
                  (value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                  value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args,
                  bool reduce_right)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined4 extraout_var;
  global_object *pgVar6;
  long lVar7;
  object *poVar8;
  native_error_exception *this;
  long lVar9;
  undefined8 extraout_RDX;
  long extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  undefined8 extraout_RDX_02;
  uint uVar11;
  pointer pvVar12;
  undefined3 in_register_00000081;
  uint uVar13;
  initializer_list<mjs::value> __l;
  allocator_type local_195;
  undefined4 local_194;
  undefined8 local_190;
  object_ptr o;
  wstring is_1;
  wstring is;
  size_type local_120;
  pointer local_118;
  value local_110;
  undefined1 local_e8 [40];
  undefined4 local_c0;
  double local_b8;
  value local_98;
  value callback;
  vector<mjs::value,_std::allocator<mjs::value>_> local_48;
  
  local_194 = CONCAT31(in_register_00000081,reduce_right);
  plVar4 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar4 + 0x88))(&o.super_gc_heap_ptr_untyped,plVar4,this_);
  puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
  callback.type_ = reference;
  callback._4_4_ = 0;
  callback.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x17e1d4;
  (**(code **)*puVar5)(&local_110,puVar5);
  uVar3 = to_uint32(&local_110);
  local_190 = CONCAT44(extraout_var,uVar3);
  value::~value(&local_110);
  pvVar12 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pvVar12 ==
      (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pvVar12 = (pointer)&value::undefined;
  }
  value::value(&callback,pvVar12);
  pgVar6 = (global_object *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  plVar4 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar4 + 0x60))(&local_110,plVar4);
  global_object::validate_type(pgVar6,&callback,(object_ptr *)&local_110,"function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_110);
  value::value(__return_storage_ptr__,(value *)&value::undefined);
  pvVar12 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar7 = (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pvVar12;
  lVar9 = lVar7 % 0x28;
  if ((ulong)(lVar7 / 0x28) < 2) {
    uVar13 = (uint)local_190;
    uVar11 = 0;
    while( true ) {
      uVar13 = uVar13 - 1;
      if (uVar13 == 0xffffffff) {
        this = (native_error_exception *)__cxa_allocate_exception(0x58);
        pgVar6 = (global_object *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
        global_object::stack_trace_abi_cxx11_((wstring *)&local_110,pgVar6);
        is._M_dataplus._M_p = (pointer)local_110.field_1.n_;
        is._M_string_length = local_110._0_8_;
        is_1._M_dataplus._M_p = (pointer)0x19;
        is_1._M_string_length = (size_type)anon_var_dwarf_83fbb;
        native_error_exception::native_error_exception
                  (this,type,(wstring_view *)&is,(string_view *)&is_1);
        __cxa_throw(this,&native_error_exception::typeinfo,
                    native_error_exception::~native_error_exception);
      }
      uVar1 = uVar11;
      if ((char)local_194 != '\0') {
        uVar1 = uVar13;
      }
      index_string_abi_cxx11_(&is,(mjs *)(ulong)uVar1,(uint32_t)lVar9);
      poVar8 = (object *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
      local_110._0_8_ = is._M_string_length;
      local_110.field_1.n_ = (double)is._M_dataplus._M_p;
      bVar2 = object::has_property(poVar8,(wstring_view *)&local_110);
      if (bVar2) break;
      std::__cxx11::wstring::~wstring((wstring *)&is);
      uVar11 = uVar11 + 1;
      lVar9 = extraout_RDX_00;
    }
    puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
    is_1._M_dataplus._M_p = (pointer)is._M_string_length;
    is_1._M_string_length = (size_type)is._M_dataplus._M_p;
    (**(code **)*puVar5)(&local_110,puVar5);
    value::operator=(__return_storage_ptr__,&local_110);
    uVar11 = uVar11 + 1;
    value::~value(&local_110);
    std::__cxx11::wstring::~wstring((wstring *)&is);
    uVar10 = extraout_RDX_01;
  }
  else {
    uVar11 = 0;
    value::operator=(__return_storage_ptr__,pvVar12 + 1);
    uVar10 = extraout_RDX;
  }
  for (; uVar11 < (uint)local_190; uVar11 = uVar11 + 1) {
    uVar13 = ~uVar11 + (uint)local_190;
    if ((char)local_194 == '\0') {
      uVar13 = uVar11;
    }
    index_string_abi_cxx11_(&is_1,(mjs *)(ulong)uVar13,(uint32_t)uVar10);
    poVar8 = (object *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
    local_110._0_8_ = is_1._M_string_length;
    local_110.field_1.n_ = (double)is_1._M_dataplus._M_p;
    bVar2 = object::has_property(poVar8,(wstring_view *)&local_110);
    if (bVar2) {
      value::value(&local_110,__return_storage_ptr__);
      puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
      local_120 = is_1._M_string_length;
      local_118 = is_1._M_dataplus._M_p;
      (**(code **)*puVar5)(local_e8,puVar5,&local_120);
      local_b8 = (double)uVar13;
      local_c0 = 3;
      value::value(&local_98,&o);
      __l._M_len = 4;
      __l._M_array = &local_110;
      std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_48,__l,&local_195);
      call_function((value *)&is,&callback,(value *)&value::undefined,&local_48);
      value::operator=(__return_storage_ptr__,(value *)&is);
      value::~value((value *)&is);
      std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_48);
      lVar9 = 0x78;
      do {
        value::~value((value *)((long)&local_110.type_ + lVar9));
        lVar9 = lVar9 + -0x28;
      } while (lVar9 != -0x28);
    }
    std::__cxx11::wstring::~wstring((wstring *)&is_1);
    uVar10 = extraout_RDX_02;
  }
  value::~value(&callback);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  return __return_storage_ptr__;
}

Assistant:

value array_reduce(gc_heap_ptr<global_object> global, const value& this_, const std::vector<value>& args, bool reduce_right) {
    auto o = global->to_object(this_);
    const auto len = to_uint32(o->get(L"length"));
    const auto callback = !args.empty() ? args[0] : value::undefined;
    global->validate_type(callback, global->function_prototype(), "function");

    value accumulator = value::undefined;
    // i always counts from 0 to len-1 (inclusive)
    uint32_t i = 0;
    // k() is the index to use (same as i if left reducing)
    auto k = [&i, len, reduce_right]() { return reduce_right ? len - 1 - i : i; };

    if (args.size() > 1) {
        // 7. initialValue is present
        accumulator = args[1];
    } else {
        // 6. len is 0 and initialValue is not present
        // 8. initialValue is not present
        for (;;) {
            if (i == len) {
                throw native_error_exception{native_error_type::type, global->stack_trace(), "cannot reduce empty array"};
            }
            const auto is = index_string(k());
            ++i; // increase i after having called k() for this loop but before breaking (since the value was consumed)
            if (o->has_property(is)) {
                accumulator = o->get(is);
                break;
            }
        }
    }

    for (; i < len; ++i) {
        const auto is = index_string(k());
        if (o->has_property(is)) {
            accumulator = call_function(callback, value::undefined, { accumulator, o->get(is), value{static_cast<double>(k())}, value{o} });
        }
    }

    return accumulator;
}